

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkItem.cxx
# Opt level: O0

void __thiscall cmLinkItem::cmLinkItem(cmLinkItem *this,string *n,cmListFileBacktrace *bt)

{
  cmListFileBacktrace *bt_local;
  string *n_local;
  cmLinkItem *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)n);
  this->Target = (cmGeneratorTarget *)0x0;
  cmListFileBacktrace::cmListFileBacktrace(&this->Backtrace,bt);
  return;
}

Assistant:

cmLinkItem::cmLinkItem(std::string n, cmListFileBacktrace bt)
  : String(std::move(n))
  , Backtrace(std::move(bt))
{
}